

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O1

bool __thiscall Screen_Manager::Pending(Screen_Manager *this,XEvent *event_return)

{
  int iVar1;
  Screen_Info *pSVar2;
  
  pSVar2 = this->head;
  do {
    iVar1 = XPending(pSVar2->dpy);
    if (iVar1 != 0) {
      if (event_return != (XEvent *)0x0) {
        XNextEvent(pSVar2->dpy,event_return);
        this->head = pSVar2->next;
      }
      break;
    }
    pSVar2 = pSVar2->next;
  } while (pSVar2 != this->head);
  return iVar1 != 0;
}

Assistant:

bool
Screen_Manager::Pending(XEvent *event_return)
{
  Screen_Info *screen = head;
  do {
    if (XPending(screen->dpy)) {
      if (event_return) {
        XNextEvent(screen->dpy, event_return);
        head = screen->next;
      }
      return true;
    }
    screen = screen->next;
  } while (screen != head);

  return false;
}